

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isNearestSampleResultValid<tcu::LookupPrecision,float>
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               int coordZ,Vector<float,_4> *result)

{
  int c;
  Sampler *pSVar1;
  bool bVar2;
  bool bVar3;
  int i;
  int y;
  int z;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector<bool,_4> res_3;
  Vector<bool,_4> res_2;
  Vector<float,_4> res;
  Vec4 diff;
  Vector<float,_4> color;
  Vec2 vBounds;
  Vec2 uBounds;
  int local_a8;
  undefined4 local_94;
  undefined4 local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  Sampler *local_70;
  undefined1 local_68 [16];
  TextureFormat local_58;
  int aiStack_50 [2];
  ConstPixelBufferAccess *local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  local_70 = sampler;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(level->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar7 = floorf(local_38);
  fVar8 = floorf(local_34);
  fVar9 = floorf(local_40);
  local_a8 = (int)fVar9;
  fVar9 = floorf(local_3c);
  local_8c = (int)fVar9;
  bVar3 = local_a8 <= local_8c;
  if (local_a8 <= local_8c) {
    c = (int)fVar7;
    pSVar1 = local_70;
    local_48 = level;
    do {
      for (; c <= (int)fVar8; c = c + 1) {
        local_70 = pSVar1;
        y = TexVerifierUtil::wrap(pSVar1->wrapS,c,(level->m_size).m_data[0]);
        z = TexVerifierUtil::wrap(pSVar1->wrapT,local_a8,(level->m_size).m_data[1]);
        if ((((y < 0) || ((level->m_size).m_data[0] <= y)) || (z < 0)) ||
           ((((level->m_size).m_data[1] <= z || (coordZ < 0)) ||
            ((level->m_size).m_data[2] <= coordZ)))) {
          sampleTextureBorder<float>((tcu *)&local_58,&level->m_format,local_70);
        }
        else {
          ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_68,(int)level,y,z);
          bVar2 = isSRGB(level->m_format);
          if (bVar2) {
            sRGBToLinear((tcu *)&local_58,(Vec4 *)local_68);
          }
          else {
            local_58.order = local_68._0_4_;
            local_58.type = local_68._4_4_;
            aiStack_50[0] = local_68._8_4_;
            aiStack_50[1] = local_68._12_4_;
          }
        }
        local_88 = 0;
        uStack_80 = 0;
        lVar4 = 0;
        do {
          *(float *)((long)&local_88 + lVar4 * 4) =
               (float)(&local_58.order)[lVar4] - result->m_data[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_68._0_4_ = R;
        local_68._4_4_ = SNORM_INT8;
        local_68._8_4_ = 0;
        local_68._12_4_ = 0;
        lVar4 = 0;
        do {
          fVar9 = *(float *)((long)&local_88 + lVar4 * 4);
          fVar10 = -fVar9;
          if (-fVar9 <= fVar9) {
            fVar10 = fVar9;
          }
          *(float *)(local_68 + lVar4 * 4) = fVar10;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_90 = 0;
        lVar4 = 0;
        do {
          *(bool *)((long)&local_90 + lVar4) =
               *(float *)(local_68 + lVar4 * 4) <= (prec->colorThreshold).m_data[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_94 = 0;
        lVar4 = 0;
        do {
          *(byte *)((long)&local_94 + lVar4) = (prec->colorMask).m_data[lVar4] ^ 1;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_88 = local_88 & 0xffffffff00000000;
        lVar4 = 0;
        do {
          *(byte *)((long)&local_88 + lVar4) =
               *(byte *)((long)&local_94 + lVar4) | *(byte *)((long)&local_90 + lVar4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        if ((char)local_88 != '\0') {
          uVar5 = 0xffffffffffffffff;
          do {
            if (uVar5 == 2) {
              uVar6 = 3;
              break;
            }
            uVar6 = uVar5 + 1;
            lVar4 = uVar5 + 2;
            uVar5 = uVar6;
          } while (*(char *)((long)&local_88 + lVar4) != '\0');
          if (2 < uVar6) {
            return bVar3;
          }
        }
        pSVar1 = local_70;
      }
      local_a8 = local_a8 + 1;
      bVar3 = local_a8 <= local_8c;
      c = (int)fVar7;
    } while (local_a8 <= local_8c);
  }
  return bVar3;
}

Assistant:

static bool isNearestSampleResultValid (const ConstPixelBufferAccess&		level,
										const Sampler&						sampler,
										const PrecType&						prec,
										const Vec2&							coord,
										const int							coordZ,
										const Vector<ScalarType, 4>&		result)
{
	const Vec2		uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		vBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int		minI			= deFloorFloatToInt32(uBounds.x());
	const int		maxI			= deFloorFloatToInt32(uBounds.y());
	const int		minJ			= deFloorFloatToInt32(vBounds.x());
	const int		maxJ			= deFloorFloatToInt32(vBounds.y());

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			const int					x		= wrap(sampler.wrapS, i, level.getWidth());
			const int					y		= wrap(sampler.wrapT, j, level.getHeight());
			const Vector<ScalarType, 4>	color	= lookup<ScalarType>(level, sampler, x, y, coordZ);

			if (isColorValid(prec, color, result))
				return true;
		}
	}

	return false;
}